

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O1

pointer __thiscall
gmlc::networking::establishConnection
          (networking *this,io_context *io_context,string *host,string *port,milliseconds timeOut)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pointer pVar4;
  SocketFactory local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.encrypted = false;
  local_28.handshake_server = false;
  local_28._18_6_ = 0;
  pVar4 = establishConnection(this,&local_28,io_context,host,port,timeOut);
  _Var3 = pVar4.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
      super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                 _M_weak_this.
                 super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
               super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
       super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
         super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
      _Var3._M_pi = extraout_RDX;
    }
  }
  pVar4.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar4.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    asio::io_context& io_context,
    const std::string& host,
    const std::string& port,
    std::chrono::milliseconds timeOut)
{
    return establishConnection(
        SocketFactory(), io_context, host, port, timeOut);
}